

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  string *layerName;
  bool bVar7;
  uint uVar8;
  bool bVar9;
  WeightParamType WVar10;
  WeightParams *pWVar11;
  long *plVar12;
  BatchnormLayerParams *pBVar13;
  LayerUnion LVar14;
  uint32 uVar15;
  size_type *psVar16;
  uint uVar17;
  char cVar18;
  bool bVar19;
  Result r;
  string err;
  size_type *local_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string local_c8;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [24];
  string local_80;
  string *local_60;
  Rep *local_58;
  string local_50;
  
  Result::Result((Result *)&local_f0);
  validateInputCount((Result *)local_a8,layer,1,1);
  local_f0 = (size_type *)local_a8;
  std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
  pcVar2 = local_98 + 8;
  if (local_a0._M_p != pcVar2) {
    operator_delete(local_a0._M_p,local_98._8_8_ + 1);
  }
  bVar9 = Result::good((Result *)&local_f0);
  if (bVar9) {
    validateOutputCount((Result *)local_a8,layer,1,1);
    local_f0 = (size_type *)local_a8;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
    if (local_a0._M_p != pcVar2) {
      operator_delete(local_a0._M_p,local_98._8_8_ + 1);
    }
  }
  bVar9 = Result::good((Result *)&local_f0);
  if (bVar9) {
    if (this->ndArrayInterpretation != true) {
LAB_002bb294:
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar14 = layer->layer_;
        uVar15 = 0xa0;
      }
      else {
        LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        uVar15 = layer->_oneof_case_[0];
      }
      pWVar11 = (WeightParams *)((LVar14.activation_)->NonlinearityType_).relu_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar3 = (pWVar11->floatvalue_).current_size_;
      uVar17 = (0 < iVar3) + 1;
      if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
        uVar17 = (uint)(0 < iVar3);
      }
      if ((iVar3 < 1) ||
         (((uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
          (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) != 1)) {
        if (uVar15 == 0xa0) {
          LVar14 = layer->layer_;
          uVar15 = 0xa0;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
          uVar15 = layer->_oneof_case_[0];
        }
        pWVar11 = (LVar14.innerproduct_)->bias_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar3 = (pWVar11->floatvalue_).current_size_;
        uVar17 = (0 < iVar3) + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar17 = (uint)(0 < iVar3);
        }
        if ((0 < iVar3) &&
           (((uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
            (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) == 1)) goto LAB_002bb3ec;
        if (uVar15 == 0xa0) {
          LVar14 = layer->layer_;
          uVar15 = 0xa0;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
          uVar15 = layer->_oneof_case_[0];
        }
        pWVar11 = (LVar14.batchnorm_)->mean_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar3 = (pWVar11->floatvalue_).current_size_;
        uVar17 = (0 < iVar3) + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar17 = (uint)(0 < iVar3);
        }
        if ((0 < iVar3) &&
           (((uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
            (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) == 1)) goto LAB_002bb3ec;
        if (uVar15 == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar14.batchnorm_)->variance_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar3 = (pWVar11->floatvalue_).current_size_;
        uVar17 = (0 < iVar3) + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar17 = (uint)(0 < iVar3);
        }
        uVar8 = (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0);
        uVar17 = (uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
        bVar9 = 1 < uVar17 - uVar8 || (uVar17 == uVar8 || iVar3 < 1);
        uVar15 = layer->_oneof_case_[0];
      }
      else {
LAB_002bb3ec:
        bVar9 = false;
      }
      if (uVar15 == 0xa0) {
        LVar14 = layer->layer_;
      }
      else {
        LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      pWVar11 = (WeightParams *)((LVar14.activation_)->NonlinearityType_).relu_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar3 = (pWVar11->floatvalue_).current_size_;
      sVar4 = ((pWVar11->float16value_).ptr_)->_M_string_length;
      uVar17 = (0 < iVar3) + 1;
      if (sVar4 == 0) {
        uVar17 = (uint)(0 < iVar3);
      }
      uVar8 = (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0);
      uVar17 = (uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
      if ((((uVar17 - uVar8 < 2) && (sVar4 != 0)) && (iVar3 < 1)) && (uVar17 != uVar8)) {
LAB_002bb55b:
        bVar19 = false;
      }
      else {
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar14.innerproduct_)->bias_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar3 = (pWVar11->floatvalue_).current_size_;
        sVar4 = ((pWVar11->float16value_).ptr_)->_M_string_length;
        uVar17 = (0 < iVar3) + 1;
        if (sVar4 == 0) {
          uVar17 = (uint)(0 < iVar3);
        }
        uVar8 = (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0);
        uVar17 = (uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
        if (((uVar17 - uVar8 < 2) && (sVar4 != 0)) && ((iVar3 < 1 && (uVar17 != uVar8))))
        goto LAB_002bb55b;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar14.batchnorm_)->mean_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar3 = (pWVar11->floatvalue_).current_size_;
        sVar4 = ((pWVar11->float16value_).ptr_)->_M_string_length;
        uVar17 = (0 < iVar3) + 1;
        if (sVar4 == 0) {
          uVar17 = (uint)(0 < iVar3);
        }
        uVar8 = (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0);
        uVar17 = (uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
        if (((uVar17 - uVar8 < 2) && (sVar4 != 0)) && ((iVar3 < 1 && (uVar17 != uVar8))))
        goto LAB_002bb55b;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar14.batchnorm_)->variance_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar3 = (pWVar11->floatvalue_).current_size_;
        sVar4 = ((pWVar11->float16value_).ptr_)->_M_string_length;
        uVar17 = (0 < iVar3) + 1;
        if (sVar4 == 0) {
          uVar17 = (uint)(0 < iVar3);
        }
        sVar5 = ((pWVar11->rawvalue_).ptr_)->_M_string_length;
        sVar6 = ((pWVar11->int8rawvalue_).ptr_)->_M_string_length;
        uVar8 = (uint)(sVar6 == 0);
        uVar17 = (uVar17 - (sVar5 == 0)) + 2;
        cVar18 = '\x04';
        if (uVar17 - uVar8 < 2) {
          cVar18 = '\x05';
          if (uVar17 != uVar8) {
            cVar18 = iVar3 < 1;
          }
          if (((((sVar4 == 0) && (iVar3 < 1)) && (uVar17 != uVar8)) &&
              (((sVar5 == 0 ||
                (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (cVar18 = '\x02', pWVar11->quantization_ == (QuantizationParams *)0x0)))) &&
             (((sVar6 == 0 ||
               (pWVar11 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
              (cVar18 = '\x03', pWVar11->quantization_ == (QuantizationParams *)0x0)))) {
            cVar18 = '\x05';
          }
        }
        bVar19 = cVar18 != '\x01';
      }
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar14 = layer->layer_;
      }
      else {
        LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      pWVar11 = (WeightParams *)((LVar14.activation_)->NonlinearityType_).relu_;
      if (pWVar11 == (WeightParams *)0x0) {
        pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      bVar7 = 0 < (pWVar11->floatvalue_).current_size_;
      uVar17 = bVar7 + 1;
      if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
        uVar17 = (uint)bVar7;
      }
      if (((uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
          (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar14.innerproduct_)->bias_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        bVar7 = 0 < (pWVar11->floatvalue_).current_size_;
        uVar17 = bVar7 + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar17 = (uint)bVar7;
        }
        if (1 < ((uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
                (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0)) goto LAB_002bb788;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar14.batchnorm_)->mean_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        bVar7 = 0 < (pWVar11->floatvalue_).current_size_;
        uVar17 = bVar7 + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar17 = (uint)bVar7;
        }
        if (1 < ((uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
                (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0)) goto LAB_002bb788;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar14.batchnorm_)->variance_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        bVar7 = 0 < (pWVar11->floatvalue_).current_size_;
        uVar17 = bVar7 + 1;
        if (((pWVar11->float16value_).ptr_)->_M_string_length == 0) {
          uVar17 = (uint)bVar7;
        }
        if ((1 < ((uVar17 - (((pWVar11->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
                 (uint)(((pWVar11->int8rawvalue_).ptr_)->_M_string_length == 0)) ||
           (!bVar9 && !bVar19)) goto LAB_002bb788;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = (LayerUnion)(layer->layer_).convolution_;
          local_58 = (Rep *)(LVar14.batchnorm_)->channels_;
        }
        else {
          pBVar13 = Specification::BatchnormLayerParams::default_instance();
          local_58 = (Rep *)pBVar13->channels_;
          if (layer->_oneof_case_[0] == 0xa0) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
          }
        }
        pWVar11 = (WeightParams *)((LVar14.activation_)->NonlinearityType_).linear_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        paVar1 = &local_c8.field_2;
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"BatchNorm","");
        local_60 = (layer->name_).ptr_;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"gamma","");
        validateGeneralWeightParams
                  ((Result *)local_a8,pWVar11,(uint64_t)local_58,1,&local_c8,local_60,&local_80);
        local_f0 = (size_type *)local_a8;
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
        if (local_a0._M_p != pcVar2) {
          operator_delete(local_a0._M_p,local_98._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        bVar9 = Result::good((Result *)&local_f0);
        if (!bVar9) goto LAB_002bbbaf;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar14.innerproduct_)->bias_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"BatchNorm","");
        local_60 = (layer->name_).ptr_;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"beta","");
        validateGeneralWeightParams
                  ((Result *)local_a8,pWVar11,(uint64_t)local_58,1,&local_c8,local_60,&local_80);
        local_f0 = (size_type *)local_a8;
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
        if (local_a0._M_p != pcVar2) {
          operator_delete(local_a0._M_p,local_98._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        bVar9 = Result::good((Result *)&local_f0);
        if (!bVar9) goto LAB_002bbbaf;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        if ((LVar14.batchnorm_)->computemeanvar_ != false) goto LAB_002bbbaf;
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar11 = (LVar14.batchnorm_)->mean_;
        if (pWVar11 == (WeightParams *)0x0) {
          pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar10 = valueType(pWVar11);
        if (WVar10 != EMPTY) {
          if (layer->_oneof_case_[0] == 0xa0) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
          }
          pWVar11 = (LVar14.batchnorm_)->mean_;
          if (pWVar11 == (WeightParams *)0x0) {
            pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          WVar10 = valueType(pWVar11);
          if (WVar10 != EMPTY) {
            if (layer->_oneof_case_[0] == 0xa0) {
              LVar14 = layer->layer_;
            }
            else {
              LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
            }
            pWVar11 = (LVar14.batchnorm_)->mean_;
            if (pWVar11 == (WeightParams *)0x0) {
              pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"BatchNorm","");
            local_60 = (layer->name_).ptr_;
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"mean","");
            validateGeneralWeightParams
                      ((Result *)local_a8,pWVar11,(uint64_t)local_58,1,&local_c8,local_60,&local_80)
            ;
            local_f0 = (size_type *)local_a8;
            std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
            if (local_a0._M_p != pcVar2) {
              operator_delete(local_a0._M_p,local_98._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            bVar9 = Result::good((Result *)&local_f0);
            if (bVar9) {
              if (layer->_oneof_case_[0] == 0xa0) {
                LVar14 = layer->layer_;
              }
              else {
                LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
              }
              pWVar11 = (LVar14.batchnorm_)->variance_;
              if (pWVar11 == (WeightParams *)0x0) {
                pWVar11 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_c8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"BatchNorm","");
              layerName = (layer->name_).ptr_;
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"variance","");
              validateGeneralWeightParams
                        ((Result *)local_a8,pWVar11,(uint64_t)local_58,1,&local_c8,layerName,
                         &local_80);
              local_f0 = (size_type *)local_a8;
              std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
              if (local_a0._M_p != pcVar2) {
                operator_delete(local_a0._M_p,local_98._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              Result::good((Result *)&local_f0);
            }
            goto LAB_002bbbaf;
          }
        }
        std::operator+(&local_c8,"Batchnorm layer \'",(layer->name_).ptr_);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_a8 = (undefined1  [8])local_98;
        psVar16 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar16) {
          local_98._0_8_ = *psVar16;
          local_98._8_8_ = plVar12[3];
        }
        else {
          local_98._0_8_ = *psVar16;
          local_a8 = (undefined1  [8])*plVar12;
        }
        local_a0._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
      }
      else {
LAB_002bb788:
        std::operator+(&local_c8,"Batchnorm layer \'",(layer->name_).ptr_);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_a8 = (undefined1  [8])local_98;
        psVar16 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar16) {
          local_98._0_8_ = *psVar16;
          local_98._8_8_ = plVar12[3];
        }
        else {
          local_98._0_8_ = *psVar16;
          local_a8 = (undefined1  [8])*plVar12;
        }
        local_a0._M_p = (pointer)plVar12[1];
        *plVar12 = (long)psVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
      }
      if (local_a8 != (undefined1  [8])local_98) {
        operator_delete((void *)local_a8,local_98._0_8_ + 1);
      }
      goto LAB_002bbbfd;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Batchnorm","");
    validateInputOutputRankEquality((Result *)local_a8,layer,&local_50,&this->blobNameToRank);
    local_f0 = (size_type *)local_a8;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
    if (local_a0._M_p != pcVar2) {
      operator_delete(local_a0._M_p,local_98._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar9 = Result::good((Result *)&local_f0);
    if (bVar9) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Batchnorm","");
      validateRankCount((Result *)local_a8,layer,&local_c8,3,-1,&this->blobNameToRank);
      local_f0 = (size_type *)local_a8;
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
      if (local_a0._M_p != pcVar2) {
        operator_delete(local_a0._M_p,local_98._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      bVar9 = Result::good((Result *)&local_f0);
      if (bVar9) goto LAB_002bb294;
    }
  }
LAB_002bbbaf:
  *(size_type **)__return_storage_ptr__ = local_f0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p == &local_d8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_d8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_e8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_e0;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_e8._M_p = (pointer)&local_d8;
LAB_002bbbfd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    r = validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta");
    if (!r.good()) return r;
    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        r = validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance");
        if (!r.good()) return r;
    }
    return r;
}